

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_pack(REF_CELL ref_cell,REF_INT *o2n)

{
  REF_STATUS RVar1;
  uint uVar2;
  REF_INT *original;
  REF_INT *sorted_index;
  void *__ptr;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT *c2n;
  REF_INT *order;
  REF_INT *key;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_INT nodes [27];
  REF_INT compact;
  REF_INT cell;
  REF_INT node;
  REF_INT *o2n_local;
  REF_CELL ref_cell_local;
  
  nodes[0x19] = 0;
  for (nodes[0x1a] = 0; nodes[0x1a] < ref_cell->max; nodes[0x1a] = nodes[0x1a] + 1) {
    RVar1 = ref_cell_nodes(ref_cell,nodes[0x1a],(REF_INT *)&ref_private_status_reis_ai);
    if (RVar1 == 0) {
      for (compact = 0; compact < ref_cell->node_per; compact = compact + 1) {
        ref_cell->c2n[compact + ref_cell->size_per * nodes[0x19]] = o2n[nodes[(long)compact + -2]];
      }
      if (ref_cell->last_node_is_an_id != 0) {
        ref_cell->c2n[ref_cell->node_per + ref_cell->size_per * nodes[0x19]] =
             nodes[(long)ref_cell->node_per + -2];
      }
      nodes[0x19] = nodes[0x19] + 1;
    }
  }
  if ((long)nodes[0x19] == (long)ref_cell->n) {
    if (ref_cell->n < ref_cell->max) {
      for (nodes[0x1a] = ref_cell->n; nodes[0x1a] < ref_cell->max; nodes[0x1a] = nodes[0x1a] + 1) {
        ref_cell->c2n[ref_cell->size_per * nodes[0x1a]] = -1;
        ref_cell->c2n[ref_cell->size_per * nodes[0x1a] + 1] = nodes[0x1a] + 1;
      }
      ref_cell->c2n[ref_cell->size_per * (ref_cell->max + -1) + 1] = -1;
      ref_cell->blank = ref_cell->n;
    }
    else {
      ref_cell->blank = -1;
    }
    if (ref_cell->n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x218,
             "ref_cell_pack","malloc key of REF_INT negative");
      ref_cell_local._4_4_ = 1;
    }
    else {
      original = (REF_INT *)malloc((long)ref_cell->n << 2);
      if (original == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x218,"ref_cell_pack","malloc key of REF_INT NULL");
        ref_cell_local._4_4_ = 2;
      }
      else if (ref_cell->n < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x219,"ref_cell_pack","malloc order of REF_INT negative");
        ref_cell_local._4_4_ = 1;
      }
      else {
        sorted_index = (REF_INT *)malloc((long)ref_cell->n << 2);
        if (sorted_index == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 0x219,"ref_cell_pack","malloc order of REF_INT NULL");
          ref_cell_local._4_4_ = 2;
        }
        else if (ref_cell->size_per * ref_cell->n < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 0x21b,"ref_cell_pack","malloc c2n of REF_INT negative");
          ref_cell_local._4_4_ = 1;
        }
        else {
          __ptr = malloc((long)(ref_cell->size_per * ref_cell->n) << 2);
          if (__ptr == (void *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                   0x21b,"ref_cell_pack","malloc c2n of REF_INT NULL");
            ref_cell_local._4_4_ = 2;
          }
          else {
            for (nodes[0x1a] = 0; nodes[0x1a] < ref_cell->max; nodes[0x1a] = nodes[0x1a] + 1) {
              RVar1 = ref_cell_nodes(ref_cell,nodes[0x1a],(REF_INT *)&ref_private_status_reis_ai);
              if (RVar1 == 0) {
                original[nodes[0x1a]] = (REF_INT)ref_private_status_reis_ai;
                for (compact = 1; compact < ref_cell->node_per; compact = compact + 1) {
                  if (nodes[(long)compact + -2] < original[nodes[0x1a]]) {
                    original[nodes[0x1a]] = nodes[(long)compact + -2];
                  }
                }
              }
            }
            ref_cell_local._4_4_ = ref_sort_heap_int(ref_cell->n,original,sorted_index);
            if (ref_cell_local._4_4_ == 0) {
              for (nodes[0x1a] = 0; nodes[0x1a] < ref_cell->n; nodes[0x1a] = nodes[0x1a] + 1) {
                for (compact = 0; compact < ref_cell->size_per; compact = compact + 1) {
                  *(REF_INT *)((long)__ptr + (long)(compact + nodes[0x1a] * ref_cell->size_per) * 4)
                       = ref_cell->c2n[compact + ref_cell->size_per * sorted_index[nodes[0x1a]]];
                }
              }
              for (nodes[0x1a] = 0; nodes[0x1a] < ref_cell->n; nodes[0x1a] = nodes[0x1a] + 1) {
                for (compact = 0; compact < ref_cell->size_per; compact = compact + 1) {
                  ref_cell->c2n[compact + ref_cell->size_per * nodes[0x1a]] =
                       *(REF_INT *)
                        ((long)__ptr + (long)(compact + nodes[0x1a] * ref_cell->size_per) * 4);
                }
              }
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
              if (sorted_index != (REF_INT *)0x0) {
                free(sorted_index);
              }
              if (original != (REF_INT *)0x0) {
                free(original);
              }
              ref_cell_local._4_4_ = ref_adj_free(ref_cell->ref_adj);
              if (ref_cell_local._4_4_ == 0) {
                ref_cell_local._4_4_ = ref_adj_create(&ref_cell->ref_adj);
                if (ref_cell_local._4_4_ == 0) {
                  for (nodes[0x1a] = 0; nodes[0x1a] < ref_cell->n; nodes[0x1a] = nodes[0x1a] + 1) {
                    for (compact = 0; compact < ref_cell->node_per; compact = compact + 1) {
                      uVar2 = ref_adj_add(ref_cell->ref_adj,
                                          ref_cell->c2n[compact + ref_cell->size_per * nodes[0x1a]],
                                          nodes[0x1a]);
                      if (uVar2 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                               ,0x23b,"ref_cell_pack",(ulong)uVar2,"register cell");
                        return uVar2;
                      }
                    }
                  }
                  ref_cell_local._4_4_ = 0;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                         ,0x235,"ref_cell_pack",(ulong)ref_cell_local._4_4_,
                         "fresh ref_adj for ref_cell");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                       ,0x234,"ref_cell_pack",(ulong)ref_cell_local._4_4_,"free adj");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                     ,0x222,"ref_cell_pack",(ulong)ref_cell_local._4_4_,"sort smallest");
            }
          }
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x209,
           "ref_cell_pack","count is off",(long)nodes[0x19],(long)ref_cell->n);
    ref_cell_local._4_4_ = 1;
  }
  return ref_cell_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cell_pack(REF_CELL ref_cell, REF_INT *o2n) {
  REF_INT node, cell, compact;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  compact = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      ref_cell_c2n(ref_cell, node, compact) = o2n[nodes[node]];
    if (ref_cell_last_node_is_an_id(ref_cell))
      ref_cell_c2n(ref_cell, ref_cell_node_per(ref_cell), compact) =
          nodes[ref_cell_node_per(ref_cell)];
    compact++;
  }
  REIS(compact, ref_cell_n(ref_cell), "count is off");

  if (ref_cell_n(ref_cell) < ref_cell_max(ref_cell)) {
    for (cell = ref_cell_n(ref_cell); cell < ref_cell_max(ref_cell); cell++) {
      ref_cell_c2n(ref_cell, 0, cell) = REF_EMPTY;
      ref_cell_c2n(ref_cell, 1, cell) = cell + 1;
    }
    ref_cell_c2n(ref_cell, 1, ref_cell_max(ref_cell) - 1) = REF_EMPTY;
    ref_cell_blank(ref_cell) = ref_cell_n(ref_cell);
  } else {
    ref_cell_blank(ref_cell) = REF_EMPTY;
  }

  {
    REF_INT *key, *order, *c2n;
    ref_malloc(key, ref_cell_n(ref_cell), REF_INT);
    ref_malloc(order, ref_cell_n(ref_cell), REF_INT);
    ref_malloc(c2n, ref_cell_size_per(ref_cell) * ref_cell_n(ref_cell),
               REF_INT);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      key[cell] = nodes[0];
      for (node = 1; node < ref_cell_node_per(ref_cell); node++) {
        if (nodes[node] < key[cell]) key[cell] = nodes[node];
      }
    }
    RSS(ref_sort_heap_int(ref_cell_n(ref_cell), key, order), "sort smallest");
    for (cell = 0; cell < ref_cell_n(ref_cell); cell++) {
      for (node = 0; node < ref_cell_size_per(ref_cell); node++) {
        c2n[node + cell * ref_cell_size_per(ref_cell)] =
            ref_cell_c2n(ref_cell, node, order[cell]);
      }
    }
    for (cell = 0; cell < ref_cell_n(ref_cell); cell++) {
      for (node = 0; node < ref_cell_size_per(ref_cell); node++) {
        ref_cell_c2n(ref_cell, node, cell) =
            c2n[node + cell * ref_cell_size_per(ref_cell)];
      }
    }
    ref_free(c2n);
    ref_free(order);
    ref_free(key);
  }

  RSS(ref_adj_free(ref_cell_adj(ref_cell)), "free adj");
  RSS(ref_adj_create(&(ref_cell->ref_adj)), "fresh ref_adj for ref_cell");

  for (cell = 0; cell < ref_cell_n(ref_cell); cell++)
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      RSS(ref_adj_add(ref_cell_adj(ref_cell),
                      ref_cell_c2n(ref_cell, node, cell), cell),
          "register cell");

  return REF_SUCCESS;
}